

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O0

double mjs::anon_unknown_37::date_helper::time_from_args
                 (vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  double dVar4;
  double dVar5;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double ms;
  double seconds;
  double minutes;
  double hours;
  double day;
  double month;
  double iyear;
  double year;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  
  sVar2 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size(args);
  if (2 < sVar2) {
    pvVar3 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[](args,0);
    iyear = to_number(pvVar3);
    dVar4 = to_integer((mjs *)pvVar3,iyear);
    uVar1 = std::isnan(iyear);
    if ((((uVar1 & 1) == 0) && (0.0 <= dVar4)) && (dVar4 <= 99.0)) {
      iyear = dVar4 + 1900.0;
    }
    pvVar3 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[](args,1);
    dVar4 = to_number(pvVar3);
    pvVar3 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[](args,2);
    dVar5 = to_number(pvVar3);
    sVar2 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size(args);
    if (sVar2 < 4) {
      local_58 = 0.0;
    }
    else {
      pvVar3 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[](args,3);
      local_58 = to_number(pvVar3);
    }
    sVar2 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size(args);
    if (sVar2 < 5) {
      local_60 = 0.0;
    }
    else {
      pvVar3 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[](args,4);
      local_60 = to_number(pvVar3);
    }
    sVar2 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size(args);
    if (sVar2 < 6) {
      local_68 = 0.0;
    }
    else {
      pvVar3 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[](args,5);
      local_68 = to_number(pvVar3);
    }
    pvVar3 = (const_reference)args;
    sVar2 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size(args);
    if (sVar2 < 7) {
      local_70 = 0.0;
    }
    else {
      pvVar3 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[](args,6);
      local_70 = to_number(pvVar3);
    }
    dVar4 = make_day(iyear,dVar4,dVar5);
    dVar5 = make_time((date_helper *)pvVar3,local_58,local_60,local_68,local_70);
    dVar4 = make_date(dVar4,dVar5);
    return dVar4;
  }
  __assert_fail("args.size() >= 3",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp"
                ,0x92,
                "static double mjs::(anonymous namespace)::date_helper::time_from_args(const std::vector<value> &)"
               );
}

Assistant:

static double time_from_args(const std::vector<value>& args) {
        assert(args.size() >= 3);
        double year = to_number(args[0]);
        if (double iyear = to_integer(year); !std::isnan(year) && iyear >= 0 && iyear <= 99) {
            year = iyear + 1900;
        }
        const double month   = to_number(args[1]);
        const double day     = to_number(args[2]);
        const double hours   = args.size() > 3 ? to_number(args[3]) : 0;
        const double minutes = args.size() > 4 ? to_number(args[4]) : 0;
        const double seconds = args.size() > 5 ? to_number(args[5]) : 0;
        const double ms      = args.size() > 6 ? to_number(args[6]) : 0;
        return date_helper::make_date(date_helper::make_day(year, month, day), date_helper::make_time(hours, minutes, seconds, ms));
    }